

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict left_op(c2m_ctx_t c2m_ctx,int no_err_p,int token,int token2,nonterm_func_t f)

{
  token_t ptVar1;
  node_t_conflict op1;
  node_t_conflict op;
  node_code_t nc;
  undefined8 uVar2;
  pos_t p;
  char *local_40;
  
  op1 = (*f)(c2m_ctx,no_err_p);
  if (op1 != &err_struct) {
    while( true ) {
      ptVar1 = c2m_ctx->parse_ctx->curr_token;
      if (*(short *)ptVar1 == token) {
        local_40 = (ptVar1->pos).fname;
        uVar2._0_4_ = (ptVar1->pos).lno;
        uVar2._4_4_ = (ptVar1->pos).ln_pos;
        nc = ptVar1->node_code;
        read_token(c2m_ctx);
      }
      else {
        if (token2 < 0) {
          return op1;
        }
        ptVar1 = c2m_ctx->parse_ctx->curr_token;
        if (*(short *)ptVar1 != token2) {
          return op1;
        }
        local_40 = (ptVar1->pos).fname;
        uVar2._0_4_ = (ptVar1->pos).lno;
        uVar2._4_4_ = (ptVar1->pos).ln_pos;
        nc = ptVar1->node_code;
        read_token(c2m_ctx);
      }
      p.lno = (int)uVar2;
      p.ln_pos = (int)((ulong)uVar2 >> 0x20);
      p.fname = local_40;
      op1 = new_pos_node1(c2m_ctx,nc,p,op1);
      op = (*f)(c2m_ctx,no_err_p);
      if (op == &err_struct) break;
      op_append(c2m_ctx,op1,op);
    }
  }
  return &err_struct;
}

Assistant:

static node_t left_op (c2m_ctx_t c2m_ctx, int no_err_p, int token, int token2, nonterm_func_t f) {
  node_code_t code;
  node_t r, n;
  pos_t pos;

  P (f);
  while (MC (token, pos, code) || (token2 >= 0 && MC (token2, pos, code))) {
    n = new_pos_node1 (c2m_ctx, code, pos, r);
    P (f);
    op_append (c2m_ctx, n, r);
    r = n;
  }
  return r;
}